

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O3

int __thiscall jrtplib::RTPSources::CreateOwnSSRC(RTPSources *this,uint32_t ssrc)

{
  RTPInternalSourceData **srcdat;
  RTPAddress *pRVar1;
  RTPMemoryManager *pRVar2;
  int iVar3;
  HashElement *pHVar4;
  RTPInternalSourceData *pRVar5;
  RTPInternalSourceData *pRVar6;
  bool created;
  bool local_31;
  
  iVar3 = -0x41;
  if (this->owndata == (RTPInternalSourceData *)0x0) {
    for (pHVar4 = (this->sourcelist).table[ssrc % 0x207d]; pHVar4 != (HashElement *)0x0;
        pHVar4 = pHVar4->hashnext) {
      if (pHVar4->key == ssrc) {
        return -0x44;
      }
    }
    srcdat = &this->owndata;
    iVar3 = ObtainSourceDataInstance(this,ssrc,srcdat,&local_31);
    if (iVar3 < 0) {
      *srcdat = (RTPInternalSourceData *)0x0;
    }
    else {
      pRVar5 = *srcdat;
      (pRVar5->super_RTPSourceData).ownssrc = true;
      (pRVar5->super_RTPSourceData).validated = true;
      pRVar1 = (pRVar5->super_RTPSourceData).rtpaddr;
      pRVar6 = pRVar5;
      if (pRVar1 != (RTPAddress *)0x0) {
        pRVar2 = (pRVar5->super_RTPSourceData).super_RTPMemoryObject.mgr;
        if (pRVar2 == (RTPMemoryManager *)0x0) {
          (*pRVar1->_vptr_RTPAddress[4])(pRVar1);
        }
        else {
          (*pRVar1->_vptr_RTPAddress[3])(pRVar1);
          (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pRVar1);
        }
        (pRVar5->super_RTPSourceData).rtpaddr = (RTPAddress *)0x0;
        pRVar6 = *srcdat;
      }
      (pRVar5->super_RTPSourceData).isrtpaddrset = true;
      pRVar1 = (pRVar6->super_RTPSourceData).rtcpaddr;
      pRVar5 = pRVar6;
      if (pRVar1 != (RTPAddress *)0x0) {
        pRVar2 = (pRVar6->super_RTPSourceData).super_RTPMemoryObject.mgr;
        if (pRVar2 == (RTPMemoryManager *)0x0) {
          (*pRVar1->_vptr_RTPAddress[4])(pRVar1,pRVar6);
        }
        else {
          (*pRVar1->_vptr_RTPAddress[3])(pRVar1);
          (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pRVar1);
        }
        (pRVar6->super_RTPSourceData).rtcpaddr = (RTPAddress *)0x0;
        pRVar5 = *srcdat;
      }
      (pRVar6->super_RTPSourceData).isrtcpaddrset = true;
      this->activecount = this->activecount + 1;
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,pRVar5);
    }
  }
  return iVar3;
}

Assistant:

int RTPSources::CreateOwnSSRC(uint32_t ssrc)
{
	if (owndata != 0)
		return ERR_RTP_SOURCES_ALREADYHAVEOWNSSRC;
	if (GotEntry(ssrc))
		return ERR_RTP_SOURCES_SSRCEXISTS;

	int status;
	bool created;
	
	status = ObtainSourceDataInstance(ssrc,&owndata,&created);
	if (status < 0)
	{
		owndata = 0; // just to make sure
		return status;
	}
	owndata->SetOwnSSRC();	
	owndata->SetRTPDataAddress(0);
	owndata->SetRTCPDataAddress(0);

	// we've created a validated ssrc, so we should increase activecount
	activecount++;

	OnNewSource(owndata);
	return 0;
}